

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::Members::~Members(Members *this)

{
  Buffer *this_00;
  
  if (((FILE *)this->file != (FILE *)0x0) && (this->close_file == true)) {
    fclose((FILE *)this->file);
  }
  this_00 = this->output_buffer;
  if (this_00 != (Buffer *)0x0) {
    Buffer::~Buffer(this_00);
  }
  operator_delete(this_00,8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->progress_reporter).
              super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->lin_pass1_filename);
  std::__cxx11::string::~string((string *)&this->deterministic_id_data);
  std::__cxx11::string::~string((string *)&this->count_buffer);
  std::_Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>::~_Vector_base
            (&(this->pipeline_stack).super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
  ::~_Rb_tree(&(this->object_stream_to_objects)._M_t);
  std::
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
  ::~_Rb_tree(&(this->contents_to_page_seq)._M_t);
  std::
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
  ::~_Rb_tree(&(this->page_object_to_seq)._M_t);
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&(this->normalized_streams)._M_t);
  ObjTable<QPDFWriter::NewObject>::~ObjTable(&(this->new_obj).super_ObjTable<QPDFWriter::NewObject>)
  ;
  ObjTable<QPDFWriter::Object>::~ObjTable(&(this->obj).super_ObjTable<QPDFWriter::Object>);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&this->object_queue);
  std::__cxx11::_List_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::
  _M_clear(&(this->to_delete).
            super__List_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>
          );
  std::__cxx11::string::~string((string *)&this->cur_data_key);
  std::__cxx11::string::~string((string *)&this->extra_header_text);
  std::__cxx11::string::~string((string *)&this->forced_pdf_version);
  std::__cxx11::string::~string((string *)&this->min_pdf_version);
  std::__cxx11::string::~string((string *)&this->final_pdf_version);
  std::__cxx11::string::~string((string *)&this->id2);
  std::__cxx11::string::~string((string *)&this->id1);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->encryption_dictionary)._M_t);
  std::__cxx11::string::~string((string *)&this->encryption_key);
  return;
}

Assistant:

QPDFWriter::Members::~Members()
{
    if (file && close_file) {
        fclose(file);
    }
    delete output_buffer;
}